

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O1

int menu_dynamic_select(menu_conflict *m)

{
  void *pvVar1;
  int iVar2;
  ui_event uVar3;
  
  uVar3 = menu_select(m,0,true);
  iVar2 = -1;
  if (uVar3.type != EVT_ESCAPE) {
    pvVar1 = m->menu_data;
    for (iVar2 = m->cursor; iVar2 != 0; iVar2 = iVar2 + -1) {
      pvVar1 = *(void **)((long)pvVar1 + 0x10);
      if (pvVar1 == (void *)0x0) {
        __assert_fail("entry",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-menu.c"
                      ,0x486,"int menu_dynamic_select(struct menu *)");
      }
    }
    iVar2 = *(int *)((long)pvVar1 + 8);
  }
  return iVar2;
}

Assistant:

int menu_dynamic_select(struct menu *m)
{
	ui_event e = menu_select(m, 0, true);
	struct menu_entry *entry;
	int cursor = m->cursor;

	if (e.type == EVT_ESCAPE)
		return -1;

	for (entry = menu_priv(m); cursor; cursor--) {
		entry = entry->next;
		assert(entry);
	}	

	return entry->value;
}